

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O2

void __thiscall
vkt::ubo::anon_unknown_0::BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
          (BlockMultiBasicTypesCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 flagsA,deUint32 flagsB,BufferMode bufferMode,int numInstances,
          MatrixLoadFlags matrixLoadFlag)

{
  ShaderInterface *this_00;
  vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *pvVar1;
  UniformBlock *pUVar2;
  UniformBlock *pUVar3;
  allocator<char> local_a9;
  VarType local_a8;
  string local_90;
  Uniform local_70;
  
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00bd5390;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"BlockA",(allocator<char> *)&local_90);
  this_00 = &(this->super_UniformBlockCase).m_interface;
  pUVar2 = ShaderInterface::allocBlock(this_00,&local_70.m_name);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"a",&local_a9);
  VarType::VarType(&local_a8,TYPE_FLOAT,4);
  Uniform::Uniform(&local_70,&local_90,&local_a8,0);
  pvVar1 = &pUVar2->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_70);
  Uniform::~Uniform(&local_70);
  VarType::~VarType(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"b",&local_a9);
  VarType::VarType(&local_a8,TYPE_UINT_VEC3,1);
  Uniform::Uniform(&local_70,&local_90,&local_a8,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_70);
  Uniform::~Uniform(&local_70);
  VarType::~VarType(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"c",&local_a9);
  VarType::VarType(&local_a8,TYPE_FLOAT_MAT2,2);
  Uniform::Uniform(&local_70,&local_90,&local_a8,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_70);
  Uniform::~Uniform(&local_70);
  VarType::~VarType(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"blockA",(allocator<char> *)&local_90);
  std::__cxx11::string::_M_assign((string *)&pUVar2->m_instanceName);
  std::__cxx11::string::~string((string *)&local_70);
  pUVar2->m_flags = flagsA;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"BlockB",(allocator<char> *)&local_90);
  pUVar3 = ShaderInterface::allocBlock(this_00,&local_70.m_name);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"a",&local_a9);
  VarType::VarType(&local_a8,TYPE_FLOAT_MAT3,2);
  Uniform::Uniform(&local_70,&local_90,&local_a8,0);
  pvVar1 = &pUVar3->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_70);
  Uniform::~Uniform(&local_70);
  VarType::~VarType(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"b",&local_a9);
  VarType::VarType(&local_a8,TYPE_INT_VEC2,1);
  Uniform::Uniform(&local_70,&local_90,&local_a8,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_70);
  Uniform::~Uniform(&local_70);
  VarType::~VarType(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"c",&local_a9);
  VarType::VarType(&local_a8,TYPE_FLOAT_VEC4,4);
  Uniform::Uniform(&local_70,&local_90,&local_a8,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_70);
  Uniform::~Uniform(&local_70);
  VarType::~VarType(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"d",&local_a9);
  VarType::VarType(&local_a8,TYPE_BOOL,0);
  Uniform::Uniform(&local_70,&local_90,&local_a8,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_70);
  Uniform::~Uniform(&local_70);
  VarType::~VarType(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"blockB",(allocator<char> *)&local_90);
  std::__cxx11::string::_M_assign((string *)&pUVar3->m_instanceName);
  std::__cxx11::string::~string((string *)&local_70);
  pUVar3->m_flags = flagsB;
  if (0 < numInstances) {
    pUVar2->m_arraySize = numInstances;
    pUVar3->m_arraySize = numInstances;
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockMultiBasicTypesCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 flagsA, deUint32 flagsB, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		UniformBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setInstanceName("blockA");
		blockA.setFlags(flagsA);

		UniformBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setInstanceName("blockB");
		blockB.setFlags(flagsB);

		if (numInstances > 0)
		{
			blockA.setArraySize(numInstances);
			blockB.setArraySize(numInstances);
		}

		init();
	}